

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

string * nlohmann::detail::exception::name(string *__return_storage_ptr__,string *ename,int id_)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  undefined8 *puVar4;
  uint uVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  uint __val;
  uint __len;
  string __str;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,"[json.exception.",ename);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_60 = *puVar6;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar6;
    local_70 = (ulong *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  __val = -id_;
  if (0 < id_) {
    __val = id_;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar5 = (uint)uVar8;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_001c7de0;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_001c7de0;
      }
      if (uVar5 < 10000) goto LAB_001c7de0;
      uVar8 = uVar8 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_001c7de0:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)__len - (char)(id_ >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)id_ >> 0x1f) + (long)local_90),__len,__val);
  uVar8 = 0xf;
  if (local_70 != &local_60) {
    uVar8 = local_60;
  }
  if (uVar8 < (ulong)(local_88 + local_68)) {
    uVar8 = 0xf;
    if (local_90 != local_80) {
      uVar8 = local_80[0];
    }
    if ((ulong)(local_88 + local_68) <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      goto LAB_001c7e6e;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
LAB_001c7e6e:
  local_b0 = &local_a0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_a0 = *plVar3;
    uStack_98 = puVar4[3];
  }
  else {
    local_a0 = *plVar3;
    local_b0 = (long *)*puVar4;
  }
  local_a8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar7) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string name(const std::string& ename, int id_)
    {
        return "[json.exception." + ename + "." + std::to_string(id_) + "] ";
    }